

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,QTreeWidgetItem *other)

{
  QTreeWidgetItemPrivate *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  QTreeWidgetItem *in_stack_ffffffffffffffd8;
  QList<QList<QWidgetItemData>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__QTreeWidgetItem_00d31678;
  *(undefined4 *)(in_RDI + 1) = 0;
  QList<QList<QWidgetItemData>_>::QList
            (in_stack_ffffffffffffffe0,(QList<QList<QWidgetItemData>_> *)in_stack_ffffffffffffffd8);
  in_RDI[5] = 0;
  this_00 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate(this_00,in_stack_ffffffffffffffd8);
  in_RDI[6] = this_00;
  in_RDI[7] = 0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x9159eb);
  *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)(in_RSI + 0x58);
  QList<QVariant>::operator=
            ((QList<QVariant> *)this_00,(QList<QVariant> *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(const QTreeWidgetItem &other)
    : rtti(Type),
      values(other.values),
      d(new QTreeWidgetItemPrivate(this)),
      itemFlags(other.itemFlags)
{
    d->display = other.d->display;
}